

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O3

int __thiscall
cmCTestMultiProcessHandler::SearchByName(cmCTestMultiProcessHandler *this,string *name)

{
  pointer __s2;
  _Base_ptr __n;
  int iVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  _Rb_tree_color _Var4;
  
  p_Var2 = (this->Properties).
           super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->Properties).
            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 == p_Var3) {
    _Var4 = ~_S_red;
  }
  else {
    __s2 = (name->_M_dataplus)._M_p;
    __n = (_Base_ptr)name->_M_string_length;
    _Var4 = ~_S_red;
    do {
      if (((p_Var2[1]._M_parent)->_M_parent == __n) &&
         ((__n == (_Base_ptr)0x0 ||
          (iVar1 = bcmp(*(void **)p_Var2[1]._M_parent,__s2,(size_t)__n), iVar1 == 0)))) {
        _Var4 = p_Var2[1]._M_color;
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  return _Var4;
}

Assistant:

int cmCTestMultiProcessHandler::SearchByName(std::string const& name)
{
  int index = -1;

  for (PropertiesMap::iterator i = this->Properties.begin();
       i != this->Properties.end(); ++i) {
    if (i->second->Name == name) {
      index = i->first;
    }
  }
  return index;
}